

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

void __thiscall foxxll::config::find_config(config *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *__s;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  long *plVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  bool bVar11;
  string basepath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ifstream in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  long local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  long *local_258 [2];
  long local_248 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  int aiStack_218 [122];
  
  pcVar3 = getenv("STXXLCFG");
  if (pcVar3 == (char *)0x0) {
    bVar11 = false;
  }
  else {
    local_258[0] = local_248;
    sVar4 = strlen(pcVar3);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,pcVar3,pcVar3 + sVar4);
    std::ifstream::ifstream(&local_238,(char *)local_258[0],_S_in);
    bVar11 = *(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18)) == 0;
    std::ifstream::~ifstream(&local_238);
    if (local_258[0] != local_248) {
      operator_delete(local_258[0],local_248[0] + 1);
    }
  }
  if (bVar11) {
    std::__cxx11::string::string((string *)&local_238,pcVar3,(allocator *)&local_378);
    (*this->_vptr_config[4])(this,&local_238);
    uVar9 = local_238.field_2._M_allocated_capacity;
    _Var10._M_p = local_238._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p == &local_238.field_2) {
      return;
    }
    goto LAB_00143c22;
  }
  pcVar3 = getenv("HOSTNAME");
  __s = getenv("HOME");
  (*this->_vptr_config[8])(&local_238);
  puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0x154ef2);
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  puVar7 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_378.field_2._M_allocated_capacity = *puVar7;
    local_378.field_2._8_8_ = puVar5[3];
  }
  else {
    local_378.field_2._M_allocated_capacity = *puVar7;
    local_378._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_378._M_string_length = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (pcVar3 == (char *)0x0) {
    bVar11 = false;
  }
  else {
    local_2b8[0] = local_2a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2b8,local_378._M_dataplus._M_p,
               local_378._M_dataplus._M_p + local_378._M_string_length);
    std::__cxx11::string::append((char *)local_2b8);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_2b8);
    local_278 = &local_268;
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_268 = *plVar8;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar8;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    local_298 = &local_288;
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_288 = *plVar8;
      lStack_280 = plVar6[3];
    }
    else {
      local_288 = *plVar8;
      local_298 = (long *)*plVar6;
    }
    local_290 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::ifstream::ifstream(&local_238,(char *)local_298,_S_in);
    bVar11 = *(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18)) == 0;
    std::ifstream::~ifstream(&local_238);
  }
  if (pcVar3 != (char *)0x0) {
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_2b8[0] != local_2a8) {
      operator_delete(local_2b8[0],local_2a8[0] + 1);
    }
  }
  if (bVar11) {
    local_338 = &local_328;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_338,local_378._M_dataplus._M_p,
               local_378._M_dataplus._M_p + local_378._M_string_length);
    std::__cxx11::string::append((char *)&local_338);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_338);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_348 = *plVar8;
      lStack_340 = plVar6[3];
      local_358 = &local_348;
    }
    else {
      local_348 = *plVar8;
      local_358 = (long *)*plVar6;
    }
    local_350 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_358);
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_238.field_2._M_allocated_capacity = *puVar7;
      local_238.field_2._8_4_ = *(undefined4 *)(puVar5 + 3);
      local_238.field_2._12_4_ = *(undefined4 *)((long)puVar5 + 0x1c);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *puVar7;
      local_238._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_238._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    (*this->_vptr_config[4])(this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if (local_358 != &local_348) {
      operator_delete(local_358,local_348 + 1);
    }
    local_2e8._M_allocated_capacity = local_328._M_allocated_capacity;
    _Var10._M_p = (pointer)local_338;
    if (local_338 != &local_328) {
LAB_00143c0c:
      operator_delete(_Var10._M_p,local_2e8._M_allocated_capacity + 1);
    }
  }
  else {
    local_358 = &local_348;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_358,local_378._M_dataplus._M_p,
               local_378._M_dataplus._M_p + local_378._M_string_length);
    std::__cxx11::string::append((char *)&local_358);
    std::ifstream::ifstream(&local_238,(char *)local_358,_S_in);
    iVar2 = *(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18));
    std::ifstream::~ifstream(&local_238);
    if (local_358 != &local_348) {
      operator_delete(local_358,local_348 + 1);
    }
    if (iVar2 == 0) {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_378._M_dataplus._M_p,
                 local_378._M_dataplus._M_p + local_378._M_string_length);
      std::__cxx11::string::append((char *)&local_238);
      (*this->_vptr_config[4])(this,&local_238);
    }
    else {
      paVar1 = &local_238.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      if (__s == (char *)0x0) goto LAB_00143ff9;
      local_358 = &local_348;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,__s,__s + sVar4);
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_358);
      puVar7 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_238.field_2._M_allocated_capacity = *puVar7;
        local_238.field_2._8_4_ = *(undefined4 *)(puVar5 + 3);
        local_238.field_2._12_4_ = *(undefined4 *)((long)puVar5 + 0x1c);
        local_238._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_238.field_2._M_allocated_capacity = *puVar7;
        local_238._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_238._M_string_length = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      (*this->_vptr_config[8])(&local_338,this);
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        uVar9 = local_238.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_330 + local_238._M_string_length) {
        uVar9 = 0xf;
        if (local_338 != &local_328) {
          uVar9 = local_328._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_330 + local_238._M_string_length) goto LAB_00143cb6;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_338,0,(char *)0x0,(ulong)local_238._M_dataplus._M_p);
      }
      else {
LAB_00143cb6:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_338);
      }
      puVar7 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_378.field_2._M_allocated_capacity = *puVar7;
        local_378.field_2._8_8_ = puVar5[3];
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      }
      else {
        local_378.field_2._M_allocated_capacity = *puVar7;
        local_378._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_378._M_string_length = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)puVar7 = 0;
      if (local_338 != &local_328) {
        operator_delete(local_338,local_328._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if (local_358 != &local_348) {
        operator_delete(local_358,local_348 + 1);
      }
      if (pcVar3 == (char *)0x0) {
        bVar11 = false;
      }
      else {
        local_2d8[0] = local_2c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2d8,local_378._M_dataplus._M_p,
                   local_378._M_dataplus._M_p + local_378._M_string_length);
        std::__cxx11::string::append((char *)local_2d8);
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_2d8);
        puVar7 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_328._M_allocated_capacity = *puVar7;
          local_328._8_8_ = puVar5[3];
          local_338 = &local_328;
        }
        else {
          local_328._M_allocated_capacity = *puVar7;
          local_338 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar5;
        }
        local_330 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_338);
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_348 = *plVar8;
          lStack_340 = plVar6[3];
          local_358 = &local_348;
        }
        else {
          local_348 = *plVar8;
          local_358 = (long *)*plVar6;
        }
        local_350 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::ifstream::ifstream(&local_238,(char *)local_358,_S_in);
        bVar11 = *(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18)) == 0;
        std::ifstream::~ifstream(&local_238);
      }
      if (pcVar3 != (char *)0x0) {
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348 + 1);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338,local_328._M_allocated_capacity + 1);
        }
        if (local_2d8[0] != local_2c8) {
          operator_delete(local_2d8[0],local_2c8[0] + 1);
        }
      }
      if (bVar11) {
        local_2f8[0] = &local_2e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2f8,local_378._M_dataplus._M_p,
                   local_378._M_dataplus._M_p + local_378._M_string_length);
        std::__cxx11::string::append((char *)local_2f8);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_2f8);
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_308 = *plVar8;
          lStack_300 = plVar6[3];
          local_318 = &local_308;
        }
        else {
          local_308 = *plVar8;
          local_318 = (long *)*plVar6;
        }
        local_310 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
        puVar7 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_238.field_2._M_allocated_capacity = *puVar7;
          local_238.field_2._8_4_ = *(undefined4 *)(puVar5 + 3);
          local_238.field_2._12_4_ = *(undefined4 *)((long)puVar5 + 0x1c);
          local_238._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_238.field_2._M_allocated_capacity = *puVar7;
          local_238._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_238._M_string_length = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        (*this->_vptr_config[4])(this);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if (local_318 != &local_308) {
          operator_delete(local_318,local_308 + 1);
        }
        _Var10._M_p = (pointer)local_2f8[0];
        if (local_2f8[0] != &local_2e8) goto LAB_00143c0c;
        goto LAB_00143c14;
      }
      local_318 = &local_308;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_318,local_378._M_dataplus._M_p,
                 local_378._M_dataplus._M_p + local_378._M_string_length);
      std::__cxx11::string::append((char *)&local_318);
      std::ifstream::ifstream(&local_238,(char *)local_318,_S_in);
      iVar2 = *(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18));
      std::ifstream::~ifstream(&local_238);
      if (local_318 != &local_308) {
        operator_delete(local_318,local_308 + 1);
      }
      if (iVar2 != 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
LAB_00143ff9:
        (*this->_vptr_config[5])(this);
        return;
      }
      std::operator+(&local_238,&local_378,"");
      (*this->_vptr_config[4])(this,&local_238);
    }
    local_2e8._M_allocated_capacity = local_238.field_2._M_allocated_capacity;
    _Var10._M_p = local_238._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) goto LAB_00143c0c;
  }
LAB_00143c14:
  uVar9 = local_378.field_2._M_allocated_capacity;
  _Var10._M_p = local_378._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p == &local_378.field_2) {
    return;
  }
LAB_00143c22:
  operator_delete(_Var10._M_p,uVar9 + 1);
  return;
}

Assistant:

void config::find_config()
{
    // check several locations for disk configuration files

    // check STXXLCFG environment path
    const char* cfg = getenv("STXXLCFG");
    if (cfg && exist_file(cfg))
        return load_config_file(cfg);

#if !FOXXLL_WINDOWS
    // read environment, unix style
    const char* hostname = getenv("HOSTNAME");
    const char* home = getenv("HOME");
    const char* suffix = "";
#else
    // read environment, windows style
    const char* hostname = getenv("COMPUTERNAME");
    const char* home = getenv("APPDATA");
    const char* suffix = ".txt";
#endif

    // check current directory
    {
        std::string basepath = "./" + default_config_file_name();

        if (hostname && exist_file(basepath + "." + hostname + suffix))
            return load_config_file(basepath + "." + hostname + suffix);

        if (exist_file(basepath + suffix))
            return load_config_file(basepath + suffix);
    }

    // check home directory
    if (home)
    {
        std::string basepath =
            std::string(home) + "/" + default_config_file_name();

        if (hostname && exist_file(basepath + "." + hostname + suffix))
            return load_config_file(basepath + "." + hostname + suffix);

        if (exist_file(basepath + suffix))
            return load_config_file(basepath + suffix);
    }

    // load default configuration
    load_default_config();
}